

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_brand(parser *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  angband_constants *paVar8;
  brand_conflict *pbVar9;
  void *pvVar10;
  undefined8 *p_00;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  errr local_34;
  
  z_info->brand_max = '\0';
  pvVar10 = parser_priv(p);
  paVar8 = z_info;
  if (pvVar10 != (void *)0x0) {
    bVar11 = z_info->brand_max;
    do {
      if (0xfd < bVar11) {
        local_34 = 0x3b;
        goto LAB_0019d11c;
      }
      bVar11 = bVar11 + 1;
      paVar8->brand_max = bVar11;
      pvVar10 = *(void **)((long)pvVar10 + 0x28);
    } while (pvVar10 != (void *)0x0);
  }
  local_34 = 0;
LAB_0019d11c:
  brands = (brand_conflict *)mem_zalloc((ulong)((uint)z_info->brand_max * 0x30) + 0x30);
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    uVar12 = 1;
    lVar13 = 0;
    do {
      pbVar9 = brands;
      puVar2 = (undefined8 *)p_00[5];
      if (uVar12 <= z_info->brand_max) {
        uVar3 = *p_00;
        uVar4 = p_00[1];
        uVar5 = p_00[2];
        uVar6 = p_00[3];
        uVar7 = p_00[5];
        puVar1 = (undefined8 *)((long)&brands[1].multiplier + lVar13);
        *puVar1 = p_00[4];
        puVar1[1] = uVar7;
        puVar1 = (undefined8 *)((long)&pbVar9[1].verb + lVar13);
        *puVar1 = uVar5;
        puVar1[1] = uVar6;
        puVar1 = (undefined8 *)((long)&pbVar9[1].code + lVar13);
        *puVar1 = uVar3;
        puVar1[1] = uVar4;
        *(undefined8 *)((long)&brands[1].next + lVar13) = 0;
      }
      mem_free(p_00);
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x30;
      p_00 = puVar2;
    } while (puVar2 != (undefined8 *)0x0);
  }
  z_info->brand_max = z_info->brand_max + '\x01';
  parser_destroy(p);
  return local_34;
}

Assistant:

static errr finish_parse_brand(struct parser *p) {
	struct brand *brand, *next = NULL;
	int count = 1;
	errr result = PARSE_ERROR_NONE;

	/* Count the entries */
	z_info->brand_max = 0;
	brand = parser_priv(p);
	while (brand) {
		if (z_info->brand_max >= 254) {
			result = PARSE_ERROR_TOO_MANY_ENTRIES;
			break;
		}
		z_info->brand_max++;
		brand = brand->next;
	}

	/* Allocate the direct access list and copy the data to it */
	brands = mem_zalloc((z_info->brand_max + 1) * sizeof(*brand));
	for (brand = parser_priv(p); brand; brand = next, count++) {
		next = brand->next;
		if (count <= z_info->brand_max) {
			memcpy(&brands[count], brand, sizeof(*brand));
			brands[count].next = NULL;
		}
		mem_free(brand);
	}
	z_info->brand_max += 1;

	parser_destroy(p);
	return result;
}